

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::EnumDescriptorProto::_InternalSerialize
          (EnumDescriptorProto *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  EnumOptions *value;
  _func_int **pp_Var1;
  EnumDescriptorProto *pEVar2;
  ptrdiff_t pVar3;
  uint32_t num;
  bool bVar4;
  int iVar5;
  SymbolVisibility value_00;
  uint32_t *puVar6;
  char *pcVar7;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  const_reference this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_02;
  const_reference this_03;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_04;
  void *__src;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  string_view s_00;
  string_view local_e8;
  const_reference local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int n_2;
  int i_2;
  EnumDescriptorProto_EnumReservedRange *repfield_1;
  uint n_1;
  uint i_1;
  EnumValueDescriptorProto *repfield;
  uint n;
  uint i;
  char *local_a0;
  string_view local_98;
  string *local_88;
  string *_s;
  EnumDescriptorProto *pEStack_78;
  uint32_t cached_has_bits;
  EnumDescriptorProto *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  EnumDescriptorProto *this_local;
  char *local_50;
  size_t local_48;
  ptrdiff_t size;
  const_reference local_38;
  uint32_t local_2c;
  EnumDescriptorProto *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  _s._4_4_ = 0;
  pEStack_78 = this;
  this_ = (EnumDescriptorProto *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  puVar6 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  _s._4_4_ = *puVar6;
  if ((_s._4_4_ & 1) != 0) {
    local_88 = _internal_name_abi_cxx11_(pEStack_78);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"google.protobuf.EnumDescriptorProto.name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,local_98);
    pEVar2 = this_;
    _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88);
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pEVar2,1,_n,(uint8_t *)stream_local);
  }
  repfield._4_4_ = 0;
  repfield._0_4_ = _internal_value_size(pEStack_78);
  for (; repfield._4_4_ < (uint)repfield; repfield._4_4_ = repfield._4_4_ + 1) {
    this_00 = _internal_value(pEStack_78);
    this_01 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::Get
                        (this_00,repfield._4_4_);
    _n_1 = this_01;
    iVar5 = EnumValueDescriptorProto::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  if ((_s._4_4_ & 2) != 0) {
    value = (pEStack_78->field_0)._impl_.options_;
    iVar5 = EnumOptions::GetCachedSize((pEStack_78->field_0)._impl_.options_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  repfield_1._4_4_ = 0;
  repfield_1._0_4_ = _internal_reserved_range_size(pEStack_78);
  for (; repfield_1._4_4_ < (uint)repfield_1; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_02 = _internal_reserved_range(pEStack_78);
    this_03 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::Get
                        (this_02,repfield_1._4_4_);
    _n_2 = this_03;
    iVar5 = EnumDescriptorProto_EnumReservedRange::GetCachedSize(this_03);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)this_03,iVar5,(uint8_t *)stream_local,
                              (EpsCopyOutputStream *)this_);
  }
  s._4_4_ = 0;
  s._0_4_ = _internal_reserved_name_size(pEStack_78);
  for (; s._4_4_ < (int)s; s._4_4_ = s._4_4_ + 1) {
    this_04 = _internal_reserved_name_abi_cxx11_(pEStack_78);
    local_d8 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(this_04,s._4_4_);
    pcVar7 = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e8,"google.protobuf.EnumDescriptorProto.reserved_name");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar7,iVar5,SERIALIZE,local_e8);
    pEVar2 = this_;
    local_28 = this_;
    local_2c = 5;
    local_38 = local_d8;
    size = (ptrdiff_t)stream_local;
    local_48 = std::__cxx11::string::size();
    pVar3 = size;
    bVar4 = true;
    if ((long)local_48 < 0x80) {
      pp_Var1 = (pEVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar5 = protobuf::io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar4 = (long)pp_Var1 + (-(long)iVar5 - pVar3) + 0xf < (long)local_48;
    }
    num = local_2c;
    if (bVar4) {
      s_00 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = s_00._M_str;
      this_local = (EnumDescriptorProto *)s_00._M_len;
      local_20 = (EpsCopyOutputStream *)
                 protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)pEVar2,num,s_00,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
  }
  if ((_s._4_4_ & 4) != 0) {
    stream_local = (EpsCopyOutputStream *)
                   protobuf::io::EpsCopyOutputStream::EnsureSpace
                             ((EpsCopyOutputStream *)this_,(uint8_t *)stream_local);
    value_00 = _internal_visibility(pEStack_78);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(6,value_00,(uint8_t *)stream_local);
  }
  bVar4 = internal::InternalMetadata::have_unknown_fields
                    (&(pEStack_78->super_Message).super_MessageLite._internal_metadata_);
  if (bVar4) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(pEStack_78->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumDescriptorProto::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string name = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_name();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(1, _s, target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_value_size());
       i < n; i++) {
    const auto& repfield = this_._internal_value().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.options_, this_._impl_.options_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_reserved_range_size());
       i < n; i++) {
    const auto& repfield = this_._internal_reserved_range().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            4, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this_._internal_reserved_name_size(); i < n; ++i) {
    const auto& s = this_._internal_reserved_name().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  // optional .google.protobuf.SymbolVisibility visibility = 6;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_visibility(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}